

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O2

int nni_chunk_append(nni_chunk *ch,void *data,size_t len)

{
  int iVar1;
  uint8_t *puVar2;
  
  if (len != 0) {
    iVar1 = nni_chunk_grow(ch,ch->ch_len + len,0);
    if (iVar1 == 0) {
      puVar2 = ch->ch_ptr;
      if (puVar2 == (uint8_t *)0x0) {
        puVar2 = ch->ch_buf;
        ch->ch_ptr = puVar2;
      }
      if (data != (void *)0x0) {
        memcpy(puVar2 + ch->ch_len,data,len);
      }
      ch->ch_len = ch->ch_len + len;
      iVar1 = 0;
    }
    return iVar1;
  }
  return 0;
}

Assistant:

static int
nni_chunk_append(nni_chunk *ch, const void *data, size_t len)
{
	int rv;

	if (len == 0) {
		return (0);
	}
	if ((rv = nni_chunk_grow(ch, len + ch->ch_len, 0)) != 0) {
		return (rv);
	}
	if (ch->ch_ptr == NULL) {
		ch->ch_ptr = ch->ch_buf;
	}
	if (data != NULL) {
		memcpy(ch->ch_ptr + ch->ch_len, data, len);
	}
	ch->ch_len += len;
	return (0);
}